

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O0

void addLearningRate<CoreML::Specification::NeuralNetwork>
               (NeuralNetwork *nn,OptimizerTypeCase optimizerType,double defaultValue,
               double minValue,double maxValue)

{
  NetworkUpdateParameters *this;
  Optimizer *this_00;
  SGDOptimizer *this_01;
  AdamOptimizer *this_02;
  DoubleRange *this_03;
  DoubleRange *doubleRange;
  DoubleParameter *learningRate;
  Optimizer *optimizer;
  NetworkUpdateParameters *updateParameters;
  double maxValue_local;
  double minValue_local;
  double defaultValue_local;
  OptimizerTypeCase optimizerType_local;
  NeuralNetwork *nn_local;
  
  this = CoreML::Specification::NeuralNetwork::mutable_updateparams(nn);
  this_00 = CoreML::Specification::NetworkUpdateParameters::mutable_optimizer(this);
  doubleRange = (DoubleRange *)0x0;
  if (optimizerType == kSgdOptimizer) {
    this_01 = CoreML::Specification::Optimizer::mutable_sgdoptimizer(this_00);
    doubleRange = (DoubleRange *)CoreML::Specification::SGDOptimizer::mutable_learningrate(this_01);
  }
  else if (optimizerType == kAdamOptimizer) {
    this_02 = CoreML::Specification::Optimizer::mutable_adamoptimizer(this_00);
    doubleRange = (DoubleRange *)CoreML::Specification::AdamOptimizer::mutable_learningrate(this_02)
    ;
  }
  CoreML::Specification::DoubleParameter::set_defaultvalue
            ((DoubleParameter *)doubleRange,defaultValue);
  this_03 = CoreML::Specification::DoubleParameter::mutable_range((DoubleParameter *)doubleRange);
  CoreML::Specification::DoubleRange::set_minvalue(this_03,minValue);
  CoreML::Specification::DoubleRange::set_maxvalue(this_03,maxValue);
  return;
}

Assistant:

void addLearningRate(NeuralNetworkClass *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, double defaultValue, double minValue,  double maxValue) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();

    Specification::DoubleParameter *learningRate = NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kSgdOptimizer:
            learningRate = optimizer->mutable_sgdoptimizer()->mutable_learningrate();
            break;
        case Specification::Optimizer::kAdamOptimizer:
            learningRate = optimizer->mutable_adamoptimizer()->mutable_learningrate();
            break;
        default:
            break;
    }
    
    learningRate->set_defaultvalue(defaultValue);
    
    auto doubleRange = learningRate->mutable_range();
    doubleRange->set_minvalue(minValue);
    doubleRange->set_maxvalue(maxValue);
}